

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::
WritePropertyWithDefault<std::map<unsigned_long,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>>>
          (Serializer *this,field_id_t field_id,char *tag,
          map<unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
          *value)

{
  byte bVar1;
  
  bVar1 = (value->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0 |
          (this->options).serialize_default_values;
  if (bVar1 == 0) {
    (*this->_vptr_Serializer[4])(this,field_id,tag,0);
  }
  else {
    (*this->_vptr_Serializer[4])(this,field_id,tag,1);
    WriteValue<unsigned_long,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>>
              (this,value);
  }
  (*this->_vptr_Serializer[5])(this,(ulong)bVar1);
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const T &value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && SerializationDefaultValue::IsDefault<T>(value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value);
		OnOptionalPropertyEnd(true);
	}